

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

int __thiscall gl4cts::SparseTexture2Tests::init(SparseTexture2Tests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  ShaderExtensionTestCase *this_00;
  StandardPageSizesTestCase *this_01;
  TestNode *pTVar1;
  UncommittedRegionsAccessTestCase *this_02;
  SparseTexture2LookupTestCase *this_03;
  allocator<char> local_31;
  string local_30;
  SparseTexture2Tests *local_10;
  SparseTexture2Tests *this_local;
  
  local_10 = this;
  this_00 = (ShaderExtensionTestCase *)operator_new(0x98);
  context = (this->super_TestCaseGroup).m_context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_ARB_sparse_texture2",&local_31);
  ShaderExtensionTestCase::ShaderExtensionTestCase(this_00,context,&local_30);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  this_01 = (StandardPageSizesTestCase *)operator_new(0xc0);
  StandardPageSizesTestCase::StandardPageSizesTestCase
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar1 = (TestNode *)operator_new(0x248);
  SparseTexture2AllocationTestCase::SparseTexture2AllocationTestCase
            ((SparseTexture2AllocationTestCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x260);
  SparseTexture2CommitmentTestCase::SparseTexture2CommitmentTestCase
            ((SparseTexture2CommitmentTestCase *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_02 = (UncommittedRegionsAccessTestCase *)operator_new(0x268);
  UncommittedRegionsAccessTestCase::UncommittedRegionsAccessTestCase
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (SparseTexture2LookupTestCase *)operator_new(0x278);
  SparseTexture2LookupTestCase::SparseTexture2LookupTestCase
            (this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  return extraout_EAX;
}

Assistant:

void SparseTexture2Tests::init()
{
	addChild(new ShaderExtensionTestCase(m_context, "GL_ARB_sparse_texture2"));
	addChild(new StandardPageSizesTestCase(m_context));
	addChild(new SparseTexture2AllocationTestCase(m_context));
	addChild(new SparseTexture2CommitmentTestCase(m_context));
	addChild(new UncommittedRegionsAccessTestCase(m_context));
	addChild(new SparseTexture2LookupTestCase(m_context));
}